

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O1

int mbedtls_gcm_self_test(int verbose)

{
  uchar (*input) [64];
  int iVar1;
  size_t length;
  size_t iv_len;
  size_t add_len;
  bool bVar2;
  int iVar3;
  uchar (*pauVar4) [16];
  uchar (*pauVar5) [64];
  uchar (*input_00) [64];
  uchar (*add) [64];
  uchar (*key) [32];
  long lVar6;
  uchar (*iv) [64];
  long lVar7;
  uint keybits;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong local_290;
  uchar (*local_278) [16];
  uchar tag_buf [16];
  uchar buf [64];
  mbedtls_gcm_context ctx;
  
  pauVar4 = tag_test_data;
  pauVar5 = ct_test_data;
  lVar9 = 0;
  do {
    uVar8 = lVar9 * 0x40 + 0x80;
    lVar7 = 0;
    lVar6 = 0;
    local_290 = 0;
    input_00 = pauVar5;
    local_278 = pauVar4;
    do {
      memset(&ctx,0,0x1a8);
      keybits = (uint)uVar8;
      if (verbose != 0) {
        printf("  AES-GCM-%3d #%d (%s): ",uVar8 & 0xffffffff,local_290,"enc");
      }
      key = key_test_data + *(int *)((long)key_index_test_data + lVar6);
      iVar3 = mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      if (iVar3 == -0x72 && uVar8 == 0xc0) {
        puts("skipped");
        bVar2 = false;
        iVar3 = -0x72;
        goto LAB_00124aa5;
      }
      if (iVar3 != 0) goto LAB_00124a8f;
      length = *(size_t *)((long)pt_len_test_data + lVar7);
      iv = iv_test_data + *(int *)((long)iv_index_test_data + lVar6);
      iv_len = *(size_t *)((long)iv_len_test_data + lVar7);
      add = additional_test_data + *(int *)((long)add_index_test_data + lVar6);
      add_len = *(size_t *)((long)add_len_test_data + lVar7);
      iVar1 = *(int *)((long)key_index_test_data + lVar6);
      input = pt_test_data + iVar1;
      iVar3 = mbedtls_gcm_crypt_and_tag
                        (&ctx,1,length,*iv,iv_len,*add,add_len,*input,buf,0x10,tag_buf);
      if (iVar3 != 0) {
LAB_00124a9e:
        bVar2 = true;
        goto LAB_00124aa5;
      }
      iVar3 = bcmp(buf,input_00,length);
      if ((iVar3 != 0) ||
         (auVar11[0] = -((*local_278)[0] == tag_buf[0]),
         auVar11[1] = -((*local_278)[1] == tag_buf[1]),
         auVar11[2] = -((*local_278)[2] == tag_buf[2]),
         auVar11[3] = -((*local_278)[3] == tag_buf[3]),
         auVar11[4] = -((*local_278)[4] == tag_buf[4]),
         auVar11[5] = -((*local_278)[5] == tag_buf[5]),
         auVar11[6] = -((*local_278)[6] == tag_buf[6]),
         auVar11[7] = -((*local_278)[7] == tag_buf[7]),
         auVar11[8] = -((*local_278)[8] == tag_buf[8]),
         auVar11[9] = -((*local_278)[9] == tag_buf[9]),
         auVar11[10] = -((*local_278)[10] == tag_buf[10]),
         auVar11[0xb] = -((*local_278)[0xb] == tag_buf[0xb]),
         auVar11[0xc] = -((*local_278)[0xc] == tag_buf[0xc]),
         auVar11[0xd] = -((*local_278)[0xd] == tag_buf[0xd]),
         auVar11[0xe] = -((*local_278)[0xe] == tag_buf[0xe]),
         auVar11[0xf] = -((*local_278)[0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                 (ushort)(auVar11[0xf] >> 7) << 0xf) != 0xffff)) {
LAB_00124a6a:
        iVar3 = 1;
        goto LAB_00124a9e;
      }
      mbedtls_cipher_free(&ctx.cipher_ctx);
      mbedtls_platform_zeroize(&ctx,0x1a8);
      if (verbose == 0) {
        memset(&ctx,0,0x1a8);
      }
      else {
        puts("passed");
        memset(&ctx,0,0x1a8);
        printf("  AES-GCM-%3d #%d (%s): ",uVar8 & 0xffffffff,local_290,"dec");
      }
      iVar3 = mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      if (iVar3 != 0) goto LAB_00124a9e;
      iVar3 = mbedtls_gcm_crypt_and_tag
                        (&ctx,0,length,*iv,iv_len,*add,add_len,*input_00,buf,0x10,tag_buf);
      if (iVar3 != 0) goto LAB_00124a9e;
      iVar3 = bcmp(buf,input,length);
      if ((iVar3 != 0) ||
         (auVar12[0] = -((*local_278)[0] == tag_buf[0]),
         auVar12[1] = -((*local_278)[1] == tag_buf[1]),
         auVar12[2] = -((*local_278)[2] == tag_buf[2]),
         auVar12[3] = -((*local_278)[3] == tag_buf[3]),
         auVar12[4] = -((*local_278)[4] == tag_buf[4]),
         auVar12[5] = -((*local_278)[5] == tag_buf[5]),
         auVar12[6] = -((*local_278)[6] == tag_buf[6]),
         auVar12[7] = -((*local_278)[7] == tag_buf[7]),
         auVar12[8] = -((*local_278)[8] == tag_buf[8]),
         auVar12[9] = -((*local_278)[9] == tag_buf[9]),
         auVar12[10] = -((*local_278)[10] == tag_buf[10]),
         auVar12[0xb] = -((*local_278)[0xb] == tag_buf[0xb]),
         auVar12[0xc] = -((*local_278)[0xc] == tag_buf[0xc]),
         auVar12[0xd] = -((*local_278)[0xd] == tag_buf[0xd]),
         auVar12[0xe] = -((*local_278)[0xe] == tag_buf[0xe]),
         auVar12[0xf] = -((*local_278)[0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                 (ushort)(auVar12[0xf] >> 7) << 0xf) != 0xffff)) goto LAB_00124a6a;
      mbedtls_cipher_free(&ctx.cipher_ctx);
      mbedtls_platform_zeroize(&ctx,0x1a8);
      if (verbose == 0) {
        memset(&ctx,0,0x1a8);
      }
      else {
        puts("passed");
        memset(&ctx,0,0x1a8);
        printf("  AES-GCM-%3d #%d split (%s): ",uVar8 & 0xffffffff,local_290,"enc");
      }
      iVar3 = mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      if ((iVar3 != 0) || (iVar3 = mbedtls_gcm_starts(&ctx,1,*iv,iv_len,*add,add_len), iVar3 != 0))
      goto LAB_00124a9e;
      if (local_290 < 2) {
        iVar3 = mbedtls_gcm_update(&ctx,length,*input,buf);
        if (iVar3 != 0) goto LAB_00124a8f;
      }
      else {
        iVar3 = mbedtls_gcm_update(&ctx,0x20,*input,buf);
        if (iVar3 == 0) {
          iVar3 = mbedtls_gcm_update(&ctx,length - 0x20,pt_test_data[iVar1] + 0x20,buf + 0x20);
          bVar10 = iVar3 == 0;
          bVar2 = !bVar10;
        }
        else {
          bVar2 = true;
          bVar10 = false;
        }
        if (!bVar10) goto LAB_00124aa5;
      }
      iVar3 = mbedtls_gcm_finish(&ctx,tag_buf,0x10);
      if (iVar3 != 0) {
LAB_00124a8f:
        bVar2 = true;
        goto LAB_00124aa5;
      }
      iVar3 = bcmp(buf,input_00,length);
      if ((iVar3 != 0) ||
         (auVar13[0] = -((*local_278)[0] == tag_buf[0]),
         auVar13[1] = -((*local_278)[1] == tag_buf[1]),
         auVar13[2] = -((*local_278)[2] == tag_buf[2]),
         auVar13[3] = -((*local_278)[3] == tag_buf[3]),
         auVar13[4] = -((*local_278)[4] == tag_buf[4]),
         auVar13[5] = -((*local_278)[5] == tag_buf[5]),
         auVar13[6] = -((*local_278)[6] == tag_buf[6]),
         auVar13[7] = -((*local_278)[7] == tag_buf[7]),
         auVar13[8] = -((*local_278)[8] == tag_buf[8]),
         auVar13[9] = -((*local_278)[9] == tag_buf[9]),
         auVar13[10] = -((*local_278)[10] == tag_buf[10]),
         auVar13[0xb] = -((*local_278)[0xb] == tag_buf[0xb]),
         auVar13[0xc] = -((*local_278)[0xc] == tag_buf[0xc]),
         auVar13[0xd] = -((*local_278)[0xd] == tag_buf[0xd]),
         auVar13[0xe] = -((*local_278)[0xe] == tag_buf[0xe]),
         auVar13[0xf] = -((*local_278)[0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                 (ushort)(auVar13[0xf] >> 7) << 0xf) != 0xffff)) {
LAB_00124a89:
        iVar3 = 1;
        goto LAB_00124a8f;
      }
      mbedtls_cipher_free(&ctx.cipher_ctx);
      mbedtls_platform_zeroize(&ctx,0x1a8);
      if (verbose == 0) {
        memset(&ctx,0,0x1a8);
      }
      else {
        puts("passed");
        memset(&ctx,0,0x1a8);
        printf("  AES-GCM-%3d #%d split (%s): ",uVar8 & 0xffffffff,local_290,"dec");
      }
      iVar3 = mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      if ((iVar3 != 0) || (iVar3 = mbedtls_gcm_starts(&ctx,0,*iv,iv_len,*add,add_len), iVar3 != 0))
      goto LAB_00124a8f;
      if (local_290 < 2) {
        iVar3 = mbedtls_gcm_update(&ctx,length,*input_00,buf);
        if (iVar3 != 0) goto LAB_00124a8f;
      }
      else {
        iVar3 = mbedtls_gcm_update(&ctx,0x20,*input_00,buf);
        if (iVar3 == 0) {
          iVar3 = mbedtls_gcm_update(&ctx,length - 0x20,*input_00 + 0x20,buf + 0x20);
          bVar10 = iVar3 == 0;
          bVar2 = !bVar10;
        }
        else {
          bVar2 = true;
          bVar10 = false;
        }
        if (!bVar10) goto LAB_00124aa5;
      }
      iVar3 = mbedtls_gcm_finish(&ctx,tag_buf,0x10);
      if (iVar3 != 0) goto LAB_00124a8f;
      iVar3 = bcmp(buf,input,length);
      if (iVar3 != 0) goto LAB_00124a89;
      auVar14[0] = -((*local_278)[0] == tag_buf[0]);
      auVar14[1] = -((*local_278)[1] == tag_buf[1]);
      auVar14[2] = -((*local_278)[2] == tag_buf[2]);
      auVar14[3] = -((*local_278)[3] == tag_buf[3]);
      auVar14[4] = -((*local_278)[4] == tag_buf[4]);
      auVar14[5] = -((*local_278)[5] == tag_buf[5]);
      auVar14[6] = -((*local_278)[6] == tag_buf[6]);
      auVar14[7] = -((*local_278)[7] == tag_buf[7]);
      auVar14[8] = -((*local_278)[8] == tag_buf[8]);
      auVar14[9] = -((*local_278)[9] == tag_buf[9]);
      auVar14[10] = -((*local_278)[10] == tag_buf[10]);
      auVar14[0xb] = -((*local_278)[0xb] == tag_buf[0xb]);
      auVar14[0xc] = -((*local_278)[0xc] == tag_buf[0xc]);
      auVar14[0xd] = -((*local_278)[0xd] == tag_buf[0xd]);
      auVar14[0xe] = -((*local_278)[0xe] == tag_buf[0xe]);
      auVar14[0xf] = -((*local_278)[0xf] == tag_buf[0xf]);
      iVar3 = 1;
      bVar2 = true;
      if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar14[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00124aa5;
      mbedtls_cipher_free(&ctx.cipher_ctx);
      mbedtls_platform_zeroize(&ctx,0x1a8);
      if (verbose != 0) {
        puts("passed");
      }
      local_290 = local_290 + 1;
      local_278 = local_278 + 1;
      input_00 = input_00 + 1;
      lVar6 = lVar6 + 4;
      lVar7 = lVar7 + 8;
    } while (lVar6 != 0x18);
    iVar3 = 0;
    bVar2 = false;
LAB_00124aa5:
    if (bVar2) {
      if (!bVar2) {
        return iVar3;
      }
      goto LAB_00124b03;
    }
    lVar9 = lVar9 + 1;
    pauVar4 = pauVar4 + 6;
    pauVar5 = pauVar5 + 6;
    if (lVar9 == 3) {
      iVar3 = 0;
      if (verbose != 0) {
        putchar(10);
      }
LAB_00124b03:
      if (iVar3 != 0) {
        if (verbose != 0) {
          puts("failed");
        }
        mbedtls_cipher_free(&ctx.cipher_ctx);
        mbedtls_platform_zeroize(&ctx,0x1a8);
      }
      return iVar3;
    }
  } while( true );
}

Assistant:

int mbedtls_gcm_self_test( int verbose )
{
    mbedtls_gcm_context ctx;
    unsigned char buf[64];
    unsigned char tag_buf[16];
    int i, j, ret;
    mbedtls_cipher_id_t cipher = MBEDTLS_CIPHER_ID_AES;

    for( j = 0; j < 3; j++ )
    {
        int key_len = 128 + 64 * j;

        for( i = 0; i < MAX_TESTS; i++ )
        {
            mbedtls_gcm_init( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d (%s): ",
                                key_len, i, "enc" );

            ret = mbedtls_gcm_setkey( &ctx, cipher,
                                      key_test_data[key_index_test_data[i]],
                                      key_len );
            /*
             * AES-192 is an optional feature that may be unavailable when
             * there is an alternative underlying implementation i.e. when
             * MBEDTLS_AES_ALT is defined.
             */
            if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && key_len == 192 )
            {
                mbedtls_printf( "skipped\n" );
                break;
            }
            else if( ret != 0 )
            {
                goto exit;
            }

            ret = mbedtls_gcm_crypt_and_tag( &ctx, MBEDTLS_GCM_ENCRYPT,
                                pt_len_test_data[i],
                                iv_test_data[iv_index_test_data[i]],
                                iv_len_test_data[i],
                                additional_test_data[add_index_test_data[i]],
                                add_len_test_data[i],
                                pt_test_data[pt_index_test_data[i]],
                                buf, 16, tag_buf );
            if( ret != 0 )
                goto exit;

            if ( memcmp( buf, ct_test_data[j * 6 + i],
                         pt_len_test_data[i] ) != 0 ||
                 memcmp( tag_buf, tag_test_data[j * 6 + i], 16 ) != 0 )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            mbedtls_gcm_init( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d (%s): ",
                                key_len, i, "dec" );

            ret = mbedtls_gcm_setkey( &ctx, cipher,
                                      key_test_data[key_index_test_data[i]],
                                      key_len );
            if( ret != 0 )
                goto exit;

            ret = mbedtls_gcm_crypt_and_tag( &ctx, MBEDTLS_GCM_DECRYPT,
                                pt_len_test_data[i],
                                iv_test_data[iv_index_test_data[i]],
                                iv_len_test_data[i],
                                additional_test_data[add_index_test_data[i]],
                                add_len_test_data[i],
                                ct_test_data[j * 6 + i], buf, 16, tag_buf );

            if( ret != 0 )
                goto exit;

            if( memcmp( buf, pt_test_data[pt_index_test_data[i]],
                        pt_len_test_data[i] ) != 0 ||
                memcmp( tag_buf, tag_test_data[j * 6 + i], 16 ) != 0 )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            mbedtls_gcm_init( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d split (%s): ",
                                key_len, i, "enc" );

            ret = mbedtls_gcm_setkey( &ctx, cipher,
                                      key_test_data[key_index_test_data[i]],
                                      key_len );
            if( ret != 0 )
                goto exit;

            ret = mbedtls_gcm_starts( &ctx, MBEDTLS_GCM_ENCRYPT,
                                  iv_test_data[iv_index_test_data[i]],
                                  iv_len_test_data[i],
                                  additional_test_data[add_index_test_data[i]],
                                  add_len_test_data[i] );
            if( ret != 0 )
                goto exit;

            if( pt_len_test_data[i] > 32 )
            {
                size_t rest_len = pt_len_test_data[i] - 32;
                ret = mbedtls_gcm_update( &ctx, 32,
                                          pt_test_data[pt_index_test_data[i]],
                                          buf );
                if( ret != 0 )
                    goto exit;

                ret = mbedtls_gcm_update( &ctx, rest_len,
                                      pt_test_data[pt_index_test_data[i]] + 32,
                                      buf + 32 );
                if( ret != 0 )
                    goto exit;
            }
            else
            {
                ret = mbedtls_gcm_update( &ctx, pt_len_test_data[i],
                                          pt_test_data[pt_index_test_data[i]],
                                          buf );
                if( ret != 0 )
                    goto exit;
            }

            ret = mbedtls_gcm_finish( &ctx, tag_buf, 16 );
            if( ret != 0 )
                goto exit;

            if( memcmp( buf, ct_test_data[j * 6 + i],
                        pt_len_test_data[i] ) != 0 ||
                memcmp( tag_buf, tag_test_data[j * 6 + i], 16 ) != 0 )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            mbedtls_gcm_init( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d split (%s): ",
                                key_len, i, "dec" );

            ret = mbedtls_gcm_setkey( &ctx, cipher,
                                      key_test_data[key_index_test_data[i]],
                                      key_len );
            if( ret != 0 )
                goto exit;

            ret = mbedtls_gcm_starts( &ctx, MBEDTLS_GCM_DECRYPT,
                              iv_test_data[iv_index_test_data[i]],
                              iv_len_test_data[i],
                              additional_test_data[add_index_test_data[i]],
                              add_len_test_data[i] );
            if( ret != 0 )
                goto exit;

            if( pt_len_test_data[i] > 32 )
            {
                size_t rest_len = pt_len_test_data[i] - 32;
                ret = mbedtls_gcm_update( &ctx, 32, ct_test_data[j * 6 + i],
                                          buf );
                if( ret != 0 )
                    goto exit;

                ret = mbedtls_gcm_update( &ctx, rest_len,
                                          ct_test_data[j * 6 + i] + 32,
                                          buf + 32 );
                if( ret != 0 )
                    goto exit;
            }
            else
            {
                ret = mbedtls_gcm_update( &ctx, pt_len_test_data[i],
                                          ct_test_data[j * 6 + i],
                                          buf );
                if( ret != 0 )
                    goto exit;
            }

            ret = mbedtls_gcm_finish( &ctx, tag_buf, 16 );
            if( ret != 0 )
                goto exit;

            if( memcmp( buf, pt_test_data[pt_index_test_data[i]],
                        pt_len_test_data[i] ) != 0 ||
                memcmp( tag_buf, tag_test_data[j * 6 + i], 16 ) != 0 )
            {
                ret = 1;
                goto exit;
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    ret = 0;

exit:
    if( ret != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );
        mbedtls_gcm_free( &ctx );
    }

    return( ret );
}